

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall
PeleLM::getDiffusivity
          (PeleLM *this,MultiFab **diffusivity,Real time,int state_comp,int dst_comp,int ncomp)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  NavierStokesBase *in_RDI;
  int in_R8D;
  undefined8 in_XMM0_Qa;
  int ncomp_00;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> math_bc;
  int diff_comp;
  int offset;
  MultiFab *diff;
  TimeLevel whichTime;
  int in_stack_000001e4;
  int in_stack_000001e8;
  int in_stack_000001ec;
  Real in_stack_000001f0;
  MultiFab **in_stack_000001f8;
  PeleLM *in_stack_00000200;
  Real in_stack_00000760;
  Array<MultiFab_*,_3> *in_stack_00000768;
  int in_stack_000008b8;
  int in_stack_000008bc;
  MultiFab *in_stack_000008c0;
  MultiFab *in_stack_000008c8;
  MultiFab *in_stack_000008d0;
  MultiFab *in_stack_000008d8;
  int in_stack_00001730;
  Geometry *in_stack_00001738;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00001740;
  Real in_stack_ffffffffffffffc8;
  
  ncomp_00 = (int)((ulong)in_XMM0_Qa >> 0x20);
  amrex::AmrLevel::which_time((AmrLevel *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffffc8);
  NavierStokesBase::fetchBCArray(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,ncomp_00);
  amrex::EB_interp_CellCentroid_to_FaceCentroid
            (in_stack_000008d8,in_stack_000008d0,in_stack_000008c8,in_stack_000008c0,
             in_stack_000008bc,in_stack_000008b8,in_stack_00001730,in_stack_00001738,
             in_stack_00001740);
  amrex::EB_set_covered_faces(in_stack_00000768,in_stack_00000760);
  if (0 < zeroBndryVisc) {
    zeroBoundaryVisc(in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001ec,
                     in_stack_000001e8,in_stack_000001e4);
  }
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x501715);
  return;
}

Assistant:

void
PeleLM::getDiffusivity (MultiFab* diffusivity[AMREX_SPACEDIM],
                        const Real time,
                        const int state_comp,
                        const int dst_comp,
                        const int ncomp)
{
   BL_PROFILE("PLM::getDiffusivity()");
   AMREX_ASSERT(state_comp > Density);
   AMREX_ASSERT(diffusivity[0]->nComp() >= dst_comp+ncomp);
   AMREX_ASSERT( ( state_comp == first_spec && ncomp == NUM_SPECIES ) ||
              ( state_comp == Temp && ncomp == 1 ) );

   //
   // Select time level to work with (N or N+1)
   //
   const TimeLevel whichTime = which_time(State_Type,time);
   AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);

   MultiFab* diff      = (whichTime == AmrOldTime) ? diffn_cc : diffnp1_cc;

   const int offset    = AMREX_SPACEDIM + 1;          // No diffusion coeff for vels or rho
   int       diff_comp = state_comp - offset;
   if (state_comp == Temp) diff_comp -= 1;            // Because RhoH is squeezed in between.

#ifdef AMREX_USE_EB
   // EB : use EB CCentroid -> FCentroid
   auto math_bc = fetchBCArray(State_Type,state_comp,ncomp);
   EB_interp_CellCentroid_to_FaceCentroid(*diff, AMREX_D_DECL(*diffusivity[0],*diffusivity[1],*diffusivity[2]),
                                          diff_comp, dst_comp, ncomp, geom, math_bc);
   EB_set_covered_faces({AMREX_D_DECL(diffusivity[0],diffusivity[1],diffusivity[2])},0.0);

#else
   // NON-EB : simply use center_to_edge_fancy
   auto math_bc = fetchBCArray(State_Type,Temp,1);
   const Box& domain = geom.Domain();
   bool use_harmonic_avg = def_harm_avg_cen2edge ? true : false;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(*diff,TilingIfNotGPU()); mfi.isValid();++mfi)
   {
      for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
      {
         const Box ebx = mfi.nodaltilebox(dir);
         const Box& edomain = amrex::surroundingNodes(domain,dir);
         const auto& diff_c  = diff->array(mfi,diff_comp);
         const auto& diff_ed = diffusivity[dir]->array(mfi,dst_comp);
         const auto bc_lo = fpi_phys_loc(math_bc[0].lo(dir));
         const auto bc_hi = fpi_phys_loc(math_bc[0].hi(dir));
         amrex::ParallelFor(ebx, [dir, bc_lo, bc_hi, ncomp, use_harmonic_avg, diff_c, diff_ed, edomain]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            int idx[3] = {i,j,k};
            bool on_lo = ( ( bc_lo == HT_Edge ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
            bool on_hi = ( ( bc_hi == HT_Edge ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
            cen2edg_cpp( i, j, k, dir, ncomp, use_harmonic_avg, on_lo, on_hi, diff_c, diff_ed);
         });
      }
   }
#endif

   if (zeroBndryVisc > 0) {
      zeroBoundaryVisc(diffusivity,time,state_comp,dst_comp,ncomp);
   }
}